

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_lightmap_section_t * golf_entity_get_lightmap_section(golf_entity_t *entity)

{
  golf_entity_type_t gVar1;
  
  gVar1 = entity->type;
  if ((gVar1 != WATER_ENTITY) && (gVar1 != GEO_ENTITY)) {
    if (gVar1 == MODEL_ENTITY) {
      return (golf_lightmap_section_t *)((long)&entity->field_4 + 0x28);
    }
    return (golf_lightmap_section_t *)0x0;
  }
  return (golf_lightmap_section_t *)&entity->field_4;
}

Assistant:

golf_lightmap_section_t *golf_entity_get_lightmap_section(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return &entity->model.lightmap_section;
        }
        case GEO_ENTITY: {
            return &entity->geo.lightmap_section;
        }
        case WATER_ENTITY: {
            return &entity->water.lightmap_section;
        }
        case HOLE_ENTITY:
        case BALL_START_ENTITY:
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}